

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

void __thiscall glslang::TVarEntryInfo::clearNewAssignments(TVarEntryInfo *this)

{
  TVarEntryInfo *this_local;
  
  this->upgradedToPushConstantPacking = ElpNone;
  this->newBinding = -1;
  this->newSet = -1;
  this->newLocation = -1;
  this->newComponent = -1;
  this->newIndex = -1;
  return;
}

Assistant:

void clearNewAssignments() {
        upgradedToPushConstantPacking = ElpNone;
        newBinding = -1;
        newSet = -1;
        newLocation = -1;
        newComponent = -1;
        newIndex = -1;
    }